

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::FinishPath(AbstractContentContext *this,GraphicOptions *inOptions)

{
  EDrawingType EVar1;
  
  EVar1 = inOptions->drawingType;
  if (EVar1 == eClip) {
    if (inOptions->close == true) {
      h(this);
    }
    W(this);
  }
  else if (EVar1 == eFill) {
    f(this);
  }
  else if (EVar1 == eStroke) {
    if (inOptions->close == true) {
      s(this);
    }
    else {
      S(this);
    }
  }
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::FinishPath(const GraphicOptions& inOptions)
{
	switch(inOptions.drawingType)
	{
		case eStroke:
			{
				if(inOptions.close)
					s();
				else
					S();
				break;
			}
		case eFill:
			{
				f();
				break;
			}
		case eClip:
			{
				if(inOptions.close)
					h();
				W();
				break;
			}

	}
	return GetCurrentStatusCode();
}